

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marker-index.cc
# Opt level: O0

ssize_t __thiscall
MarkerIndex::splice(MarkerIndex *this,int __fdin,__off64_t *__offin,int __fdout,__off64_t *__offout,
                   size_t __len,uint __flags)

{
  pointer *this_00;
  uint value;
  bool bVar1;
  int iVar2;
  Node *node;
  Node *node_00;
  Point PVar3;
  reference puVar4;
  size_t sVar5;
  mapped_type *ppNVar6;
  uint in_register_0000000c;
  undefined4 in_register_00000034;
  MarkerIndex *this_01;
  uint local_19c;
  iterator iStack_198;
  MarkerId id_7;
  iterator __end2_4;
  iterator __begin2_4;
  flat_set<unsigned_int> *__range2_4;
  iterator iStack_178;
  MarkerId id_6;
  iterator __end2_3;
  iterator __begin2_3;
  flat_set<unsigned_int> *__range2_3;
  uint local_14c;
  iterator iStack_148;
  MarkerId id_5;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_140;
  iterator iter_2;
  iterator iStack_130;
  MarkerId id_4;
  iterator __end2_2;
  iterator __begin2_2;
  MarkerIdSet *__range2_2;
  iterator iStack_110;
  MarkerId id_3;
  iterator __end2_1;
  iterator __begin2_1;
  flat_set<unsigned_int> *__range2_1;
  iterator iStack_f0;
  MarkerId id_2;
  iterator __end2;
  iterator __begin2;
  MarkerIdSet *__range2;
  uint local_cc;
  iterator iStack_c8;
  MarkerId id_1;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_c0;
  iterator iter_1;
  uint local_ac;
  iterator iStack_a8;
  MarkerId id;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_a0;
  iterator iter;
  MarkerIdSet ending_inside_splice;
  MarkerIdSet starting_inside_splice;
  Node *end_node;
  Node *start_node;
  bool is_insertion;
  MarkerIndex *this_local;
  Point new_extent_local;
  Point old_extent_local;
  Point start_local;
  SpliceResult *invalidated;
  
  this_01 = (MarkerIndex *)CONCAT44(in_register_00000034,__fdin);
  new_extent_local.column = in_register_0000000c;
  new_extent_local.row = __fdout;
  this_local = (MarkerIndex *)__offout;
  old_extent_local = (Point)__offin;
  std::
  unordered_map<const_MarkerIndex::Node_*,_Point,_std::hash<const_MarkerIndex::Node_*>,_std::equal_to<const_MarkerIndex::Node_*>,_std::allocator<std::pair<const_MarkerIndex::Node_*const,_Point>_>_>
  ::clear(&this_01->node_position_cache);
  SpliceResult::SpliceResult((SpliceResult *)this);
  if ((this_01->root != (Node *)0x0) &&
     ((bVar1 = Point::is_zero(&new_extent_local), !bVar1 ||
      (bVar1 = Point::is_zero((Point *)&this_local), !bVar1)))) {
    bVar1 = Point::is_zero(&new_extent_local);
    node = Iterator::insert_splice_boundary(&this_01->iterator,&old_extent_local,false);
    starting_inside_splice.contents.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)Point::traverse(&old_extent_local,&new_extent_local);
    node_00 = Iterator::insert_splice_boundary
                        (&this_01->iterator,
                         (Point *)&starting_inside_splice.contents.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,bVar1);
    node->priority = -1;
    bubble_node_up(this_01,node);
    node_00->priority = -2;
    bubble_node_up(this_01,node_00);
    flat_set<unsigned_int>::flat_set
              ((flat_set<unsigned_int> *)
               &ending_inside_splice.contents.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    flat_set<unsigned_int>::flat_set((flat_set<unsigned_int> *)&iter);
    if (bVar1) {
      local_a0._M_current = (uint *)flat_set<unsigned_int>::begin(&node->start_marker_ids);
      while( true ) {
        iStack_a8 = flat_set<unsigned_int>::end(&node->start_marker_ids);
        bVar1 = __gnu_cxx::operator!=(&local_a0,&stack0xffffffffffffff58);
        if (!bVar1) break;
        puVar4 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_a0);
        local_ac = *puVar4;
        sVar5 = flat_set<unsigned_int>::count(&this_01->exclusive_marker_ids,local_ac);
        if (sVar5 == 0) {
          __gnu_cxx::
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++(&local_a0);
        }
        else {
          iter_1 = flat_set<unsigned_int>::erase(&node->start_marker_ids,&local_a0);
          local_a0._M_current = iter_1._M_current;
          flat_set<unsigned_int>::erase(&node->right_marker_ids,local_ac);
          flat_set<unsigned_int>::insert(&node_00->start_marker_ids,local_ac);
          ppNVar6 = std::
                    unordered_map<unsigned_int,_MarkerIndex::Node_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>_>
                    ::operator[](&this_01->start_nodes_by_id,&local_ac);
          *ppNVar6 = node_00;
        }
      }
      local_c0._M_current = (uint *)flat_set<unsigned_int>::begin(&node->end_marker_ids);
      while( true ) {
        iStack_c8 = flat_set<unsigned_int>::end(&node->end_marker_ids);
        bVar1 = __gnu_cxx::operator!=(&local_c0,&stack0xffffffffffffff38);
        if (!bVar1) break;
        puVar4 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_c0);
        local_cc = *puVar4;
        sVar5 = flat_set<unsigned_int>::count(&this_01->exclusive_marker_ids,local_cc);
        if ((sVar5 == 0) ||
           (sVar5 = flat_set<unsigned_int>::count(&node_00->start_marker_ids,local_cc), sVar5 != 0))
        {
          local_c0._M_current =
               (uint *)flat_set<unsigned_int>::erase(&node->end_marker_ids,&local_c0);
          sVar5 = flat_set<unsigned_int>::count(&node_00->start_marker_ids,local_cc);
          if (sVar5 == 0) {
            flat_set<unsigned_int>::insert(&node->right_marker_ids,local_cc);
          }
          flat_set<unsigned_int>::insert(&node_00->end_marker_ids,local_cc);
          ppNVar6 = std::
                    unordered_map<unsigned_int,_MarkerIndex::Node_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>_>
                    ::operator[](&this_01->end_nodes_by_id,&local_cc);
          *ppNVar6 = node_00;
        }
        else {
          __gnu_cxx::
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++(&local_c0);
        }
      }
    }
    else {
      get_starting_and_ending_markers_within_subtree
                (this_01,node->right,
                 (MarkerIdSet *)
                 &ending_inside_splice.contents.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(MarkerIdSet *)&iter);
      __end2 = flat_set<unsigned_int>::begin((flat_set<unsigned_int> *)&iter);
      iStack_f0 = flat_set<unsigned_int>::end((flat_set<unsigned_int> *)&iter);
      while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffff10), bVar1) {
        puVar4 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end2);
        __range2_1._4_4_ = *puVar4;
        flat_set<unsigned_int>::insert(&node_00->end_marker_ids,__range2_1._4_4_);
        sVar5 = flat_set<unsigned_int>::count
                          ((flat_set<unsigned_int> *)
                           &ending_inside_splice.contents.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,__range2_1._4_4_);
        if (sVar5 == 0) {
          flat_set<unsigned_int>::insert(&node->right_marker_ids,__range2_1._4_4_);
        }
        ppNVar6 = std::
                  unordered_map<unsigned_int,_MarkerIndex::Node_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>_>
                  ::operator[](&this_01->end_nodes_by_id,(key_type *)((long)&__range2_1 + 4));
        *ppNVar6 = node_00;
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end2);
      }
      __end2_1 = flat_set<unsigned_int>::begin(&node_00->end_marker_ids);
      iStack_110 = flat_set<unsigned_int>::end(&node_00->end_marker_ids);
      while (bVar1 = __gnu_cxx::operator!=(&__end2_1,&stack0xfffffffffffffef0), bVar1) {
        puVar4 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end2_1);
        value = *puVar4;
        sVar5 = flat_set<unsigned_int>::count(&this_01->exclusive_marker_ids,value);
        if ((sVar5 != 0) &&
           (sVar5 = flat_set<unsigned_int>::count(&node_00->start_marker_ids,value), sVar5 == 0)) {
          flat_set<unsigned_int>::insert((flat_set<unsigned_int> *)&iter,value);
        }
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end2_1);
      }
      this_00 = &ending_inside_splice.contents.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      __end2_2 = flat_set<unsigned_int>::begin((flat_set<unsigned_int> *)this_00);
      iStack_130 = flat_set<unsigned_int>::end((flat_set<unsigned_int> *)this_00);
      while (bVar1 = __gnu_cxx::operator!=(&__end2_2,&stack0xfffffffffffffed0), bVar1) {
        puVar4 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end2_2);
        iter_2._M_current._4_4_ = *puVar4;
        flat_set<unsigned_int>::insert(&node_00->start_marker_ids,iter_2._M_current._4_4_);
        ppNVar6 = std::
                  unordered_map<unsigned_int,_MarkerIndex::Node_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>_>
                  ::operator[](&this_01->start_nodes_by_id,
                               (key_type *)((long)&iter_2._M_current + 4));
        *ppNVar6 = node_00;
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end2_2);
      }
      local_140._M_current = (uint *)flat_set<unsigned_int>::begin(&node->start_marker_ids);
      while( true ) {
        iStack_148 = flat_set<unsigned_int>::end(&node->start_marker_ids);
        bVar1 = __gnu_cxx::operator!=(&local_140,&stack0xfffffffffffffeb8);
        if (!bVar1) break;
        puVar4 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_140);
        local_14c = *puVar4;
        sVar5 = flat_set<unsigned_int>::count(&this_01->exclusive_marker_ids,local_14c);
        if ((sVar5 == 0) ||
           (sVar5 = flat_set<unsigned_int>::count(&node->end_marker_ids,local_14c), sVar5 != 0)) {
          __gnu_cxx::
          __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
          ::operator++(&local_140);
        }
        else {
          local_140._M_current =
               (uint *)flat_set<unsigned_int>::erase(&node->start_marker_ids,&local_140);
          flat_set<unsigned_int>::erase(&node->right_marker_ids,local_14c);
          flat_set<unsigned_int>::insert(&node_00->start_marker_ids,local_14c);
          ppNVar6 = std::
                    unordered_map<unsigned_int,_MarkerIndex::Node_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>_>
                    ::operator[](&this_01->start_nodes_by_id,&local_14c);
          *ppNVar6 = node_00;
          flat_set<unsigned_int>::insert
                    ((flat_set<unsigned_int> *)
                     &ending_inside_splice.contents.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,local_14c);
        }
      }
    }
    populate_splice_invalidation_sets
              (this_01,(SpliceResult *)this,node,node_00,
               (MarkerIdSet *)
               &ending_inside_splice.contents.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(MarkerIdSet *)&iter);
    if (node->right != (Node *)0x0) {
      delete_subtree(this_01,node->right);
      node->right = (Node *)0x0;
    }
    PVar3 = Point::traverse(&old_extent_local,(Point *)&this_local);
    node_00->left_extent = PVar3;
    bVar1 = Point::operator==(&node->left_extent,&node_00->left_extent);
    if (bVar1) {
      __end2_3 = flat_set<unsigned_int>::begin(&node_00->start_marker_ids);
      iStack_178 = flat_set<unsigned_int>::end(&node_00->start_marker_ids);
      while (bVar1 = __gnu_cxx::operator!=(&__end2_3,&stack0xfffffffffffffe88), bVar1) {
        puVar4 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end2_3);
        __range2_4._4_4_ = *puVar4;
        flat_set<unsigned_int>::insert(&node->start_marker_ids,__range2_4._4_4_);
        flat_set<unsigned_int>::insert(&node->right_marker_ids,__range2_4._4_4_);
        ppNVar6 = std::
                  unordered_map<unsigned_int,_MarkerIndex::Node_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>_>
                  ::operator[](&this_01->start_nodes_by_id,(key_type *)((long)&__range2_4 + 4));
        *ppNVar6 = node;
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end2_3);
      }
      __end2_4 = flat_set<unsigned_int>::begin(&node_00->end_marker_ids);
      iStack_198 = flat_set<unsigned_int>::end(&node_00->end_marker_ids);
      while (bVar1 = __gnu_cxx::operator!=(&__end2_4,&stack0xfffffffffffffe68), bVar1) {
        puVar4 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&__end2_4);
        local_19c = *puVar4;
        flat_set<unsigned_int>::insert(&node->end_marker_ids,local_19c);
        sVar5 = flat_set<unsigned_int>::count(&node_00->left_marker_ids,local_19c);
        if (sVar5 != 0) {
          flat_set<unsigned_int>::insert(&node->left_marker_ids,local_19c);
          flat_set<unsigned_int>::erase(&node_00->left_marker_ids,local_19c);
        }
        ppNVar6 = std::
                  unordered_map<unsigned_int,_MarkerIndex::Node_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_MarkerIndex::Node_*>_>_>
                  ::operator[](&this_01->end_nodes_by_id,&local_19c);
        *ppNVar6 = node;
        __gnu_cxx::
        __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
        ::operator++(&__end2_4);
      }
      delete_node(this_01,node_00);
    }
    else {
      bVar1 = Node::is_marker_endpoint(node_00);
      if (bVar1) {
        iVar2 = generate_random_number(this_01);
        node_00->priority = iVar2;
        bubble_node_down(this_01,node_00);
      }
      else {
        delete_node(this_01,node_00);
      }
    }
    bVar1 = Node::is_marker_endpoint(node);
    if (bVar1) {
      iVar2 = generate_random_number(this_01);
      node->priority = iVar2;
      bubble_node_down(this_01,node);
    }
    else {
      delete_node(this_01,node);
    }
    flat_set<unsigned_int>::~flat_set((flat_set<unsigned_int> *)&iter);
    flat_set<unsigned_int>::~flat_set
              ((flat_set<unsigned_int> *)
               &ending_inside_splice.contents.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return (ssize_t)this;
}

Assistant:

MarkerIndex::SpliceResult MarkerIndex::splice(Point start, Point old_extent, Point new_extent) {
  node_position_cache.clear();

  SpliceResult invalidated;

  if (!root || (old_extent.is_zero() && new_extent.is_zero())) return invalidated;

  bool is_insertion = old_extent.is_zero();
  Node *start_node = iterator.insert_splice_boundary(start, false);
  Node *end_node = iterator.insert_splice_boundary(start.traverse(old_extent), is_insertion);

  start_node->priority = -1;
  bubble_node_up(start_node);
  end_node->priority = -2;
  bubble_node_up(end_node);

  MarkerIdSet starting_inside_splice;
  MarkerIdSet ending_inside_splice;

  if (is_insertion) {
    for (auto iter = start_node->start_marker_ids.begin(); iter != start_node->start_marker_ids.end();) {
      MarkerId id = *iter;
      if (exclusive_marker_ids.count(id) > 0) {
        iter = start_node->start_marker_ids.erase(iter);
        start_node->right_marker_ids.erase(id);
        end_node->start_marker_ids.insert(id);
        start_nodes_by_id[id] = end_node;
      } else {
        ++iter;
      }
    }
    for (auto iter = start_node->end_marker_ids.begin(); iter != start_node->end_marker_ids.end();) {
      MarkerId id = *iter;
      if (exclusive_marker_ids.count(id) == 0 || end_node->start_marker_ids.count(id) > 0) {
        iter = start_node->end_marker_ids.erase(iter);
        if (end_node->start_marker_ids.count(id) == 0) {
          start_node->right_marker_ids.insert(id);
        }
        end_node->end_marker_ids.insert(id);
        end_nodes_by_id[id] = end_node;
      } else {
        ++iter;
      }
    }
  } else {
    get_starting_and_ending_markers_within_subtree(start_node->right, &starting_inside_splice, &ending_inside_splice);

    for (MarkerId id : ending_inside_splice) {
      end_node->end_marker_ids.insert(id);
      if (!starting_inside_splice.count(id)) {
        start_node->right_marker_ids.insert(id);
      }
      end_nodes_by_id[id] = end_node;
    }

    for (MarkerId id : end_node->end_marker_ids) {
      if (exclusive_marker_ids.count(id) && !end_node->start_marker_ids.count(id)) {
        ending_inside_splice.insert(id);
      }
    }

    for (MarkerId id : starting_inside_splice) {
      end_node->start_marker_ids.insert(id);
      start_nodes_by_id[id] = end_node;
    }

    for (auto iter = start_node->start_marker_ids.begin(); iter != start_node->start_marker_ids.end();) {
      MarkerId id = *iter;
      if (exclusive_marker_ids.count(id) && !start_node->end_marker_ids.count(id)) {
        iter = start_node->start_marker_ids.erase(iter);
        start_node->right_marker_ids.erase(id);
        end_node->start_marker_ids.insert(id);
        start_nodes_by_id[id] = end_node;
        starting_inside_splice.insert(id);
      } else {
        ++iter;
      }
    }
  }

  populate_splice_invalidation_sets(&invalidated, start_node, end_node, starting_inside_splice, ending_inside_splice);

  if (start_node->right) {
    delete_subtree(start_node->right);
    start_node->right = nullptr;
  }

  end_node->left_extent = start.traverse(new_extent);

  if (start_node->left_extent == end_node->left_extent) {
    for (MarkerId id : end_node->start_marker_ids) {
      start_node->start_marker_ids.insert(id);
      start_node->right_marker_ids.insert(id);
      start_nodes_by_id[id] = start_node;
    }

    for (MarkerId id : end_node->end_marker_ids) {
      start_node->end_marker_ids.insert(id);
      if (end_node->left_marker_ids.count(id) > 0) {
        start_node->left_marker_ids.insert(id);
        end_node->left_marker_ids.erase(id);
      }
      end_nodes_by_id[id] = start_node;
    }
    delete_node(end_node);
  } else if (end_node->is_marker_endpoint()) {
    end_node->priority = generate_random_number();
    bubble_node_down(end_node);
  } else {
    delete_node(end_node);
  }

  if (start_node->is_marker_endpoint()) {
    start_node->priority = generate_random_number();
    bubble_node_down(start_node);
  } else {
    delete_node(start_node);
  }

  return invalidated;
}